

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaConstructionCtxtPtr xmlSchemaConstructionCtxtCreate(xmlDictPtr dict)

{
  xmlSchemaConstructionCtxtPtr con;
  xmlSchemaItemListPtr pxVar1;
  
  con = (xmlSchemaConstructionCtxtPtr)(*xmlMalloc)(0x48);
  if (con == (xmlSchemaConstructionCtxtPtr)0x0) {
    xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x10,
                        (xmlError *)0x0);
  }
  else {
    con->substGroups = (xmlHashTablePtr)0x0;
    con->redefs = (xmlSchemaRedefPtr_conflict)0x0;
    con->bucket = (xmlSchemaBucketPtr_conflict)0x0;
    con->pending = (xmlSchemaItemListPtr)0x0;
    con->dict = (xmlDictPtr)0x0;
    con->buckets = (xmlSchemaItemListPtr)0x0;
    con->mainSchema = (xmlSchemaPtr)0x0;
    con->mainBucket = (xmlSchemaBucketPtr_conflict)0x0;
    con->lastRedef = (xmlSchemaRedefPtr_conflict)0x0;
    pxVar1 = xmlSchemaItemListCreate();
    con->buckets = pxVar1;
    if (pxVar1 == (xmlSchemaItemListPtr)0x0) {
      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x10,
                          (xmlError *)0x0);
      (*xmlFree)(con);
    }
    else {
      pxVar1 = xmlSchemaItemListCreate();
      con->pending = pxVar1;
      if (pxVar1 != (xmlSchemaItemListPtr)0x0) {
        con->dict = dict;
        xmlDictReference(dict);
        return con;
      }
      xmlRaiseMemoryError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)0x0,(void *)0x0,0x10,
                          (xmlError *)0x0);
      xmlSchemaConstructionCtxtFree(con);
    }
  }
  return (xmlSchemaConstructionCtxtPtr)0x0;
}

Assistant:

static xmlSchemaConstructionCtxtPtr
xmlSchemaConstructionCtxtCreate(xmlDictPtr dict)
{
    xmlSchemaConstructionCtxtPtr ret;

    ret = (xmlSchemaConstructionCtxtPtr)
	xmlMalloc(sizeof(xmlSchemaConstructionCtxt));
    if (ret == NULL) {
        xmlSchemaPErrMemory(NULL);
        return (NULL);
    }
    memset(ret, 0, sizeof(xmlSchemaConstructionCtxt));

    ret->buckets = xmlSchemaItemListCreate();
    if (ret->buckets == NULL) {
	xmlSchemaPErrMemory(NULL);
	xmlFree(ret);
        return (NULL);
    }
    ret->pending = xmlSchemaItemListCreate();
    if (ret->pending == NULL) {
	xmlSchemaPErrMemory(NULL);
	xmlSchemaConstructionCtxtFree(ret);
        return (NULL);
    }
    ret->dict = dict;
    xmlDictReference(dict);
    return(ret);
}